

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.h
# Opt level: O0

void __thiscall cmQtAutoGenerator::ProcessResultT::ProcessResultT(ProcessResultT *this)

{
  ProcessResultT *this_local;
  
  this->ExitStatus = 0;
  this->TermSignal = 0;
  std::__cxx11::string::string((string *)&this->StdOut);
  std::__cxx11::string::string((string *)&this->StdErr);
  std::__cxx11::string::string((string *)&this->ErrorMessage);
  return;
}

Assistant:

bool error() const
    {
      return (ExitStatus != 0) || (TermSignal != 0) || !ErrorMessage.empty();
    }